

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::TruncCase::compare(TruncCase *this,void **inputs,void **outputs)

{
  float fVar1;
  float a;
  bool bVar2;
  int iVar3;
  deUint32 value;
  int iVar4;
  deUint32 dVar5;
  reference pvVar6;
  ostream *poVar7;
  Hex<8UL> HVar8;
  size_t *siglen;
  uchar *sig;
  EVP_PKEY_CTX *ctx;
  uchar *in_R8;
  size_t in_R9;
  float fVar9;
  float local_a4;
  int local_88;
  deUint32 ulpDiff_1;
  int roundedVal;
  bool anyOk;
  int maxRes;
  int minRes;
  float out0_1;
  float in0_1;
  int compNdx_1;
  float eps;
  deUint32 maxUlpDiff;
  int mantissaBits;
  HexFloat local_54;
  deUint32 local_50;
  float local_4c;
  deUint32 ulpDiff;
  float ref;
  float local_40;
  float fStack_3c;
  bool isNeg;
  float out0;
  float in0;
  int compNdx;
  int scalarSize;
  Precision precision;
  DataType type;
  void **outputs_local;
  void **inputs_local;
  TruncCase *this_local;
  
  _precision = outputs;
  outputs_local = inputs;
  inputs_local = (void **)this;
  pvVar6 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_CommonFunctionCase).m_spec.inputs,0);
  scalarSize = glu::VarType::getBasicType(&pvVar6->varType);
  ctx = (EVP_PKEY_CTX *)0x0;
  pvVar6 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_CommonFunctionCase).m_spec.inputs,0);
  compNdx = glu::VarType::getPrecision(&pvVar6->varType);
  in0 = (float)glu::getDataTypeScalarSize(scalarSize);
  if ((compNdx == 2) || (compNdx == 1)) {
    for (out0 = 0.0; (int)out0 < (int)in0; out0 = (float)((int)out0 + 1)) {
      fStack_3c = *(float *)((long)*outputs_local + (long)(int)out0 * 4);
      siglen = (size_t *)(long)(int)out0;
      local_40 = *(float *)((long)*_precision + (long)siglen * 4);
      tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float
                ((Float<unsigned_int,_8,_23,_127,_3U> *)&ulpDiff,fStack_3c);
      iVar3 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::sign
                        ((Float<unsigned_int,_8,_23,_127,_3U> *)&ulpDiff,ctx,sig,siglen,in_R8,in_R9)
      ;
      ref._3_1_ = iVar3 < 0;
      if ((bool)ref._3_1_) {
        local_a4 = -(float)(int)-fStack_3c;
      }
      else {
        local_a4 = (float)(int)fStack_3c;
      }
      local_4c = local_a4;
      local_50 = getUlpDiffIgnoreZeroSign(local_40,local_a4);
      if (local_50 != 0) {
        poVar7 = std::operator<<(&(this->super_CommonFunctionCase).m_failMsg.
                                  super_basic_ostream<char,_std::char_traits<char>_>,"Expected [");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)out0);
        poVar7 = std::operator<<(poVar7,"] = ");
        HexFloat::HexFloat(&local_54,local_4c);
        poVar7 = Functional::operator<<(poVar7,&local_54);
        poVar7 = std::operator<<(poVar7,", got ULP diff ");
        HVar8 = tcu::toHex<unsigned_int>(local_50);
        tcu::Format::operator<<(poVar7,HVar8);
        return false;
      }
      local_50 = 0;
    }
  }
  else {
    iVar3 = getMinMantissaBits(compNdx);
    value = getMaxUlpDiffFromBits(iVar3);
    fVar9 = getEpsFromBits(1.0,iVar3);
    for (out0_1 = 0.0; (int)out0_1 < (int)in0; out0_1 = (float)((int)out0_1 + 1)) {
      fVar1 = *(float *)((long)*outputs_local + (long)(int)out0_1 * 4);
      a = *(float *)((long)*_precision + (long)(int)out0_1 * 4);
      iVar4 = (int)(fVar1 + fVar9);
      bVar2 = false;
      iVar3 = (int)(fVar1 - fVar9);
      for (local_88 = iVar3; local_88 <= iVar4; local_88 = local_88 + 1) {
        dVar5 = getUlpDiffIgnoreZeroSign(a,(float)local_88);
        if (dVar5 <= value) {
          bVar2 = true;
          break;
        }
      }
      if (!bVar2) {
        poVar7 = std::operator<<(&(this->super_CommonFunctionCase).m_failMsg.
                                  super_basic_ostream<char,_std::char_traits<char>_>,"Expected [");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)out0_1);
        poVar7 = std::operator<<(poVar7,"] = [");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
        poVar7 = std::operator<<(poVar7,", ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
        poVar7 = std::operator<<(poVar7,"] with ULP threshold ");
        HVar8 = tcu::toHex<unsigned_int>(value);
        tcu::Format::operator<<(poVar7,HVar8);
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			// Require exact result.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const bool		isNeg		= tcu::Float32(in0).sign() < 0;
				const float		ref			= isNeg ? (-float(int(-in0))) : float(int(in0));

				// \note: trunc() function definition is a bit broad on negative zeros. Ignore result sign if zero.
				const deUint32	ulpDiff		= getUlpDiffIgnoreZeroSign(out0, ref);

				if (ulpDiff > 0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
					return false;
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);	// ULP diff for rounded integer value.
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const int		minRes		= int(in0-eps);
				const int		maxRes		= int(in0+eps);
				bool			anyOk		= false;

				for (int roundedVal = minRes; roundedVal <= maxRes; roundedVal++)
				{
					const deUint32 ulpDiff = getUlpDiffIgnoreZeroSign(out0, float(roundedVal));

					if (ulpDiff <= maxUlpDiff)
					{
						anyOk = true;
						break;
					}
				}

				if (!anyOk)
				{
					m_failMsg << "Expected [" << compNdx << "] = [" << minRes << ", " << maxRes << "] with ULP threshold " << tcu::toHex(maxUlpDiff);
					return false;
				}
			}
		}

		return true;
	}